

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledMisc.cpp
# Opt level: O0

Box2i Imf_3_3::dataWindowForLevel
                (TileDescription *tileDesc,int minX,int maxX,int minY,int maxY,int lx,int ly)

{
  int iVar1;
  int iVar2;
  int in_EDX;
  Vec2<int> extraout_RDX;
  Vec2<int> in_RDI;
  int in_R8D;
  Box2i BVar3;
  V2i levelMax;
  V2i levelMin;
  undefined4 in_stack_ffffffffffffffb0;
  Vec2<int> this;
  LevelRoundingMode in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  Vec2<int> local_28 [5];
  
  this = in_RDI;
  Imath_3_1::Vec2<int>::Vec2(local_28,in_EDX,in_R8D);
  iVar1 = levelSize(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                    in_stack_ffffffffffffffc8);
  iVar1 = iVar1 + -1;
  iVar2 = levelSize(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                    in_stack_ffffffffffffffc8);
  Imath_3_1::Vec2<int>::Vec2((Vec2<int> *)&stack0xffffffffffffffc8,iVar1,iVar2 + -1);
  Imath_3_1::Vec2<int>::operator+
            ((Vec2<int> *)in_RDI,(Vec2<int> *)CONCAT44(iVar1,in_stack_ffffffffffffffb0));
  Imath_3_1::Box<Imath_3_1::Vec2<int>_>::Box
            ((Box<Imath_3_1::Vec2<int>_> *)this,(Vec2<int> *)in_RDI,
             (Vec2<int> *)CONCAT44(iVar1,in_stack_ffffffffffffffb0));
  BVar3.max = extraout_RDX;
  BVar3.min = this;
  return BVar3;
}

Assistant:

Box2i
dataWindowForLevel (
    const TileDescription& tileDesc,
    int                    minX,
    int                    maxX,
    int                    minY,
    int                    maxY,
    int                    lx,
    int                    ly)
{
    V2i levelMin = V2i (minX, minY);

    V2i levelMax =
        levelMin + V2i (
                       levelSize (minX, maxX, lx, tileDesc.roundingMode) - 1,
                       levelSize (minY, maxY, ly, tileDesc.roundingMode) - 1);

    return Box2i (levelMin, levelMax);
}